

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Peers.hpp
# Opt level: O3

void __thiscall
ableton::link::
Peers<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_std::reference_wrapper<ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionPeerCounter>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionTimelineCallback>
::forgetSession(Peers<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_std::reference_wrapper<ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionPeerCounter>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionTimelineCallback>
                *this,SessionId *sid)

{
  element_type *peVar1;
  __normal_iterator<std::pair<ableton::link::PeerState,_asio::ip::address>_*,_std::vector<std::pair<ableton::link::PeerState,_asio::ip::address>,_std::allocator<std::pair<ableton::link::PeerState,_asio::ip::address>_>_>_>
  __first;
  
  peVar1 = (this->mpImpl).
           super___shared_ptr<ableton::link::Peers<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_std::reference_wrapper<ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionPeerCounter>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionTimelineCallback>::Impl,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  __first = std::
            __remove_if<__gnu_cxx::__normal_iterator<std::pair<ableton::link::PeerState,asio::ip::address>*,std::vector<std::pair<ableton::link::PeerState,asio::ip::address>,std::allocator<std::pair<ableton::link::PeerState,asio::ip::address>>>>,__gnu_cxx::__ops::_Iter_pred<ableton::link::Peers<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>&,std::reference_wrapper<ableton::link::Controller<std::function<void(unsigned_long)>,std::function<void(ableton::link::Tempo)>,ableton::platforms::linux::Clock<1>,ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>>::SessionPeerCounter>,ableton::link::Controller<std::function<void(unsigned_long)>,std::function<void(ableton::link::Tempo)>,ableton::platforms::linux::Clock<1>,ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>>::SessionTimelineCallback>::SessionMemberPred>>
                      ((peVar1->mPeers).
                       super__Vector_base<std::pair<ableton::link::PeerState,_asio::ip::address>,_std::allocator<std::pair<ableton::link::PeerState,_asio::ip::address>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       *(pointer *)
                        ((long)&(peVar1->mPeers).
                                super__Vector_base<std::pair<ableton::link::PeerState,_asio::ip::address>,_std::allocator<std::pair<ableton::link::PeerState,_asio::ip::address>_>_>
                                ._M_impl.super__Vector_impl_data + 8),
                       (_Iter_pred<ableton::link::Peers<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_std::reference_wrapper<ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionPeerCounter>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionTimelineCallback>::SessionMemberPred>
                        )sid);
  std::
  vector<std::pair<ableton::link::PeerState,_asio::ip::address>,_std::allocator<std::pair<ableton::link::PeerState,_asio::ip::address>_>_>
  ::_M_erase(&peVar1->mPeers,(iterator)__first._M_current,
             *(pointer *)
              ((long)&(peVar1->mPeers).
                      super__Vector_base<std::pair<ableton::link::PeerState,_asio::ip::address>,_std::allocator<std::pair<ableton::link::PeerState,_asio::ip::address>_>_>
                      ._M_impl.super__Vector_impl_data + 8));
  return;
}

Assistant:

void forgetSession(const SessionId& sid)
  {
    using namespace std;
    auto& peerVec = mpImpl->mPeers;
    peerVec.erase(
      remove_if(begin(peerVec), end(peerVec), SessionMemberPred{sid}), end(peerVec));
  }